

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

void * file_stdio_fopen(char *path,char *mode)

{
  _Bool _Var1;
  FILE *__stream;
  char *in_RSI;
  char *in_RDI;
  USERDATA *userdata;
  FILE *fp;
  int in_stack_00000024;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  char *in_stack_ffffffffffffffd8;
  undefined8 *local_8;
  
  _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                           path);
  if (_Var1) {
    _al_trace_suffix("opening %s %s\n",in_RDI,in_RSI);
  }
  __stream = fopen(in_RDI,in_RSI);
  if (__stream == (FILE *)0x0) {
    __errno_location();
    al_set_errno((int)((ulong)__stream >> 0x20));
    local_8 = (undefined8 *)0x0;
  }
  else {
    local_8 = (undefined8 *)
              al_malloc_with_context
                        ((size_t)in_RSI,(int)((ulong)__stream >> 0x20),in_stack_ffffffffffffffd8,
                         (char *)0x1769ad);
    if (local_8 == (undefined8 *)0x0) {
      fclose(__stream);
      local_8 = (undefined8 *)0x0;
    }
    else {
      *local_8 = __stream;
      *(undefined4 *)(local_8 + 1) = 0;
    }
  }
  return local_8;
}

Assistant:

static void *file_stdio_fopen(const char *path, const char *mode)
{
   FILE *fp;
   USERDATA *userdata;

   ALLEGRO_DEBUG("opening %s %s\n", path, mode);

#ifdef ALLEGRO_WINDOWS
   {
      wchar_t *wpath = _al_win_utf8_to_utf16(path);
      wchar_t *wmode = _al_win_utf8_to_utf16(mode);
      fp = _wfopen(wpath, wmode);
      al_free(wpath);
      al_free(wmode);
   }
#else
   fp = fopen(path, mode);
#endif

   if (!fp) {
      al_set_errno(errno);
      return NULL;
   }

   userdata = al_malloc(sizeof(USERDATA));
   if (!userdata) {
      fclose(fp);
      return NULL;
   }

   userdata->fp = fp;
   userdata->errnum = 0;

   return userdata;
}